

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

void BDF_Face_Done(FT_Face bdfface)

{
  FT_Memory memory_00;
  FT_Memory memory;
  BDF_Face face;
  FT_Face bdfface_local;
  
  if (bdfface != (FT_Face)0x0) {
    memory_00 = bdfface->memory;
    bdf_free_font((bdf_font_t *)bdfface[1].face_flags);
    ft_mem_free(memory_00,(void *)bdfface[1].style_flags);
    bdfface[1].style_flags = 0;
    ft_mem_free(memory_00,(void *)bdfface[1].num_faces);
    bdfface[1].num_faces = 0;
    ft_mem_free(memory_00,(void *)bdfface[1].face_index);
    bdfface[1].face_index = 0;
    ft_mem_free(memory_00,bdfface->family_name);
    bdfface->family_name = (FT_String *)0x0;
    ft_mem_free(memory_00,bdfface->style_name);
    bdfface->style_name = (FT_String *)0x0;
    ft_mem_free(memory_00,bdfface->available_sizes);
    bdfface->available_sizes = (FT_Bitmap_Size *)0x0;
    ft_mem_free(memory_00,(void *)bdfface[1].face_flags);
    bdfface[1].face_flags = 0;
  }
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  BDF_Face_Done( FT_Face  bdfface )         /* BDF_Face */
  {
    BDF_Face   face = (BDF_Face)bdfface;
    FT_Memory  memory;


    if ( !face )
      return;

    memory = FT_FACE_MEMORY( face );

    bdf_free_font( face->bdffont );

    FT_FREE( face->en_table );

    FT_FREE( face->charset_encoding );
    FT_FREE( face->charset_registry );
    FT_FREE( bdfface->family_name );
    FT_FREE( bdfface->style_name );

    FT_FREE( bdfface->available_sizes );

    FT_FREE( face->bdffont );
  }